

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-type.c
# Opt level: O2

coda_grib_value_array *
coda_grib_value_array_simple_packing_new
          (coda_type_array *definition,long num_elements,int64_t byte_offset,int element_bit_size,
          int16_t decimalScaleFactor,int16_t binaryScaleFactor,float referenceValue,uint8_t *bitmask
          )

{
  byte bVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  coda_grib_value_array *type;
  uint8_t *puVar5;
  ulong uVar6;
  uint uVar7;
  size_t __size;
  
  type = coda_grib_value_array_new(definition,num_elements,byte_offset);
  if (type == (coda_grib_value_array *)0x0) {
    type = (coda_grib_value_array *)0x0;
  }
  else {
    type->simple_packing = 1;
    type->element_bit_size = element_bit_size;
    type->decimalScaleFactor = decimalScaleFactor;
    type->binaryScaleFactor = binaryScaleFactor;
    type->referenceValue = referenceValue;
    dVar3 = fpow(2,(long)binaryScaleFactor);
    dVar4 = fpow(10,-(long)decimalScaleFactor);
    auVar2._8_4_ = SUB84(dVar4 * (double)referenceValue,0);
    auVar2._0_8_ = dVar4 * dVar3;
    auVar2._12_4_ = (int)((ulong)(dVar4 * (double)referenceValue) >> 0x20);
    type->scalefactor = dVar4 * dVar3;
    type->offset = (double)auVar2._8_8_;
    type->bitmask = (uint8_t *)0x0;
    type->bitmask_cumsum128 = (uint8_t *)0x0;
    if (bitmask != (uint8_t *)0x0) {
      __size = ((num_elements >> 3) + 1) - (ulong)((num_elements & 7U) == 0);
      puVar5 = (uint8_t *)malloc(__size);
      type->bitmask = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        uVar7 = 0xad;
      }
      else {
        memcpy(puVar5,bitmask,__size);
        puVar5 = (uint8_t *)malloc(__size);
        type->bitmask_cumsum128 = puVar5;
        if (puVar5 != (uint8_t *)0x0) {
          uVar6 = 0;
          if ((long)__size < 1) {
            __size = uVar6;
          }
          for (; __size != uVar6; uVar6 = uVar6 + 1) {
            bVar1 = type->bitmask[uVar6];
            type->bitmask_cumsum128[uVar6] =
                 ((bVar1 & 1) - ((char)bVar1 >> 7)) + (bVar1 >> 6 & 1) + ((bVar1 >> 5 & 1) != 0) +
                 (bVar1 >> 4 & 1) + ((bVar1 >> 3 & 1) != 0) + (bVar1 >> 2 & 1) +
                 ((bVar1 >> 1 & 1) != 0);
            if ((uVar6 & 0xf) != 0) {
              puVar5 = type->bitmask_cumsum128 + uVar6;
              *puVar5 = *puVar5 + type->bitmask_cumsum128[uVar6 - 1];
            }
          }
          return type;
        }
        uVar7 = 0xb7;
      }
      coda_grib_type_delete((coda_dynamic_type *)type);
      type = (coda_grib_value_array *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-type.c"
                     ,(ulong)uVar7);
    }
  }
  return type;
}

Assistant:

coda_grib_value_array *coda_grib_value_array_simple_packing_new(coda_type_array *definition, long num_elements,
                                                                int64_t byte_offset, int element_bit_size,
                                                                int16_t decimalScaleFactor, int16_t binaryScaleFactor,
                                                                float referenceValue, const uint8_t *bitmask)
{
    coda_grib_value_array *type;
    long bitmask_size;
    long i;

    type = coda_grib_value_array_new(definition, num_elements, byte_offset);
    if (type == NULL)
    {
        return NULL;
    }

    type->simple_packing = 1;
    type->element_bit_size = element_bit_size;
    type->decimalScaleFactor = decimalScaleFactor;
    type->binaryScaleFactor = binaryScaleFactor;
    type->referenceValue = referenceValue;
    type->scalefactor = fpow(2, binaryScaleFactor) * fpow(10, -decimalScaleFactor);
    type->offset = referenceValue * fpow(10, -decimalScaleFactor);
    type->bitmask = NULL;
    type->bitmask_cumsum128 = NULL;

    if (bitmask != NULL)
    {
        bitmask_size = bit_size_to_byte_size(num_elements);
        type->bitmask = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        memcpy(type->bitmask, bitmask, bitmask_size);

        type->bitmask_cumsum128 = (uint8_t *)malloc(bitmask_size * sizeof(uint8_t));
        if (type->bitmask_cumsum128 == NULL)
        {
            coda_grib_type_delete((coda_dynamic_type *)type);
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(bitmask_size * sizeof(uint8_t)), __FILE__, __LINE__);
            return NULL;
        }
        for (i = 0; i < bitmask_size; i++)
        {
            uint8_t bm = type->bitmask[i];

            type->bitmask_cumsum128[i] = ((bm >> 7) & 1) + ((bm >> 6) & 1) + ((bm >> 5) & 1) + ((bm >> 4) & 1) +
                ((bm >> 3) & 1) + ((bm >> 2) & 1) + ((bm >> 1) & 1) + (bm & 1);
            if (i % 16 != 0)
            {
                type->bitmask_cumsum128[i] += type->bitmask_cumsum128[i - 1];
            }
        }
    }

    return type;
}